

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_tests.cpp
# Opt level: O3

void skiwi::format_test_7(void)

{
  string res;
  format_options ops;
  long *local_318 [2];
  long local_308 [2];
  long *local_2f8 [2];
  long local_2e8 [2];
  long *local_2d8;
  long local_2d0;
  long local_2c8 [2];
  format_options local_2b4 [4];
  undefined4 local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  long *local_288 [2];
  long local_278 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  long *local_248 [2];
  long local_238 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  long *local_208 [2];
  long local_1f8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  long *local_1c8 [2];
  long local_1b8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  long *local_188 [2];
  long local_178 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  long *local_148 [2];
  long local_138 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  long *local_108 [2];
  long local_f8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  long *local_c8 [2];
  long local_b8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  long *local_88 [2];
  long local_78 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  long *local_48 [2];
  long local_38 [2];
  
  skiwi::format_options::format_options(local_2b4);
  local_2b0 = 10;
  local_2f8[0] = local_2e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2f8,
             "(define newton lambda(guess function derivative epsilon) (define guess2 (- guess (/ (function guess) (derivative guess)))) (if (< (abs(- guess guess2)) epsilon) guess2 (newton guess2 function derivative epsilon)))"
             ,"");
  skiwi::format((string *)local_48,(format_options *)local_2f8);
  anon_unknown_0::cleanup((anon_unknown_0 *)&local_2d8,(EVP_PKEY_CTX *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  if (local_2f8[0] != local_2e8) {
    operator_delete(local_2f8[0],local_2e8[0] + 1);
  }
  local_188[0] = local_178;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_188,
             "\n(define newton lambda\n  (guess function derivative epsilon)\n  (define guess2\n    (- guess\n      (/ (function guess)\n         (derivative guess))))\n  (if (< (abs\n           (- guess guess2))\n         epsilon)\n      guess2\n      (newton guess2 function derivative epsilon)))\n"
             ,"");
  anon_unknown_0::cleanup((anon_unknown_0 *)&local_68,(EVP_PKEY_CTX *)local_188);
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a8,local_2d8,local_2d0 + (long)local_2d8);
  TestEq<std::__cxx11::string,std::__cxx11::string>
            (&local_68,&local_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/format_tests.cpp"
             ,0xe6,"void skiwi::format_test_7()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_188[0] != local_178) {
    operator_delete(local_188[0],local_178[0] + 1);
  }
  local_318[0] = local_308;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_318,"(case (car \'(c d)) [(a) \'a] [(b) \'b])","");
  skiwi::format((string *)local_88,(format_options *)local_318);
  anon_unknown_0::cleanup((anon_unknown_0 *)local_2f8,(EVP_PKEY_CTX *)local_88);
  std::__cxx11::string::operator=((string *)&local_2d8,(string *)local_2f8);
  if (local_2f8[0] != local_2e8) {
    operator_delete(local_2f8[0],local_2e8[0] + 1);
  }
  if (local_88[0] != local_78) {
    operator_delete(local_88[0],local_78[0] + 1);
  }
  if (local_318[0] != local_308) {
    operator_delete(local_318[0],local_308[0] + 1);
  }
  local_1c8[0] = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c8,
             "\n(case (car\n        \'(c d))\n        [(a)\n         \'a]\n        [(b)\n         \'b])\n"
             ,"");
  anon_unknown_0::cleanup((anon_unknown_0 *)&local_a8,(EVP_PKEY_CTX *)local_1c8);
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,local_2d8,local_2d0 + (long)local_2d8);
  TestEq<std::__cxx11::string,std::__cxx11::string>
            (&local_a8,&local_1e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/format_tests.cpp"
             ,0xf0,"void skiwi::format_test_7()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0],local_1b8[0] + 1);
  }
  local_318[0] = local_308;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_318,"(string #\\j #\\a #\\n #\\n #\\e #\\m #\\a #\\n)","");
  skiwi::format((string *)local_c8,(format_options *)local_318);
  anon_unknown_0::cleanup((anon_unknown_0 *)local_2f8,(EVP_PKEY_CTX *)local_c8);
  std::__cxx11::string::operator=((string *)&local_2d8,(string *)local_2f8);
  if (local_2f8[0] != local_2e8) {
    operator_delete(local_2f8[0],local_2e8[0] + 1);
  }
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0],local_b8[0] + 1);
  }
  if (local_318[0] != local_308) {
    operator_delete(local_318[0],local_308[0] + 1);
  }
  local_208[0] = local_1f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_208,"\n(string #\\j #\\a #\\n #\\n #\\e #\\m #\\a #\\n)\n","");
  anon_unknown_0::cleanup((anon_unknown_0 *)&local_e8,(EVP_PKEY_CTX *)local_208);
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_228,local_2d8,local_2d0 + (long)local_2d8);
  TestEq<std::__cxx11::string,std::__cxx11::string>
            (&local_e8,&local_228,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/format_tests.cpp"
             ,0xf5,"void skiwi::format_test_7()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if (local_208[0] != local_1f8) {
    operator_delete(local_208[0],local_1f8[0] + 1);
  }
  local_318[0] = local_308;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_318,"quote (\"Hello\" \"World\")","");
  skiwi::format((string *)local_108,(format_options *)local_318);
  anon_unknown_0::cleanup((anon_unknown_0 *)local_2f8,(EVP_PKEY_CTX *)local_108);
  std::__cxx11::string::operator=((string *)&local_2d8,(string *)local_2f8);
  if (local_2f8[0] != local_2e8) {
    operator_delete(local_2f8[0],local_2e8[0] + 1);
  }
  if (local_108[0] != local_f8) {
    operator_delete(local_108[0],local_f8[0] + 1);
  }
  if (local_318[0] != local_308) {
    operator_delete(local_318[0],local_308[0] + 1);
  }
  local_248[0] = local_238;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_248,"\nquote (\"Hello\" \"World\")\n","");
  anon_unknown_0::cleanup((anon_unknown_0 *)&local_128,(EVP_PKEY_CTX *)local_248);
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_268,local_2d8,local_2d0 + (long)local_2d8);
  TestEq<std::__cxx11::string,std::__cxx11::string>
            (&local_128,&local_268,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/format_tests.cpp"
             ,0xfa,"void skiwi::format_test_7()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if (local_248[0] != local_238) {
    operator_delete(local_248[0],local_238[0] + 1);
  }
  local_318[0] = local_308;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_318,
             "(letrec([f (lambda(i)  (when (<= i 100000) (let([x (list 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0)]) (f(add1 i)))))]) (f 0) 100)"
             ,"");
  skiwi::format((string *)local_148,(format_options *)local_318);
  anon_unknown_0::cleanup((anon_unknown_0 *)local_2f8,(EVP_PKEY_CTX *)local_148);
  std::__cxx11::string::operator=((string *)&local_2d8,(string *)local_2f8);
  if (local_2f8[0] != local_2e8) {
    operator_delete(local_2f8[0],local_2e8[0] + 1);
  }
  if (local_148[0] != local_138) {
    operator_delete(local_148[0],local_138[0] + 1);
  }
  if (local_318[0] != local_308) {
    operator_delete(local_318[0],local_308[0] + 1);
  }
  local_288[0] = local_278;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_288,
             "\n(letrec ([f (lambda\n              (i)\n              (when\n                (<= i 100000)\n                (let\n                  ([x (list 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0)])\n                  (f (add1 i)))))])\n        (f 0)\n        100)\n"
             ,"");
  anon_unknown_0::cleanup((anon_unknown_0 *)&local_168,(EVP_PKEY_CTX *)local_288);
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2a8,local_2d8,local_2d0 + (long)local_2d8);
  TestEq<std::__cxx11::string,std::__cxx11::string>
            (&local_168,&local_2a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/format_tests.cpp"
             ,0x107,"void skiwi::format_test_7()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if (local_288[0] != local_278) {
    operator_delete(local_288[0],local_278[0] + 1);
  }
  if (local_2d8 != local_2c8) {
    operator_delete(local_2d8,local_2c8[0] + 1);
  }
  return;
}

Assistant:

void format_test_7()
  {
  format_options ops;
  ops.max_width = 10;
  auto res = cleanup(format("(define newton lambda(guess function derivative epsilon) (define guess2 (- guess (/ (function guess) (derivative guess)))) (if (< (abs(- guess guess2)) epsilon) guess2 (newton guess2 function derivative epsilon)))", ops));
  TEST_EQ(cleanup(R"(
(define newton lambda
  (guess function derivative epsilon)
  (define guess2
    (- guess
      (/ (function guess)
         (derivative guess))))
  (if (< (abs
           (- guess guess2))
         epsilon)
      guess2
      (newton guess2 function derivative epsilon)))
)"), res);

  res = cleanup(format("(case (car '(c d)) [(a) 'a] [(b) 'b])", ops));
  TEST_EQ(cleanup(R"(
(case (car
        '(c d))
        [(a)
         'a]
        [(b)
         'b])
)"), res);

  res = cleanup(format(R"((string #\j #\a #\n #\n #\e #\m #\a #\n))", ops));
  TEST_EQ(cleanup(R"(
(string #\j #\a #\n #\n #\e #\m #\a #\n)
)"), res);

  res = cleanup(format("quote (\"Hello\" \"World\")", ops));
  TEST_EQ(cleanup(R"(
quote ("Hello" "World")
)"), res);

  res = cleanup(format("(letrec([f (lambda(i)  (when (<= i 100000) (let([x (list 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0)]) (f(add1 i)))))]) (f 0) 100)", ops));
  TEST_EQ(cleanup(R"(
(letrec ([f (lambda
              (i)
              (when
                (<= i 100000)
                (let
                  ([x (list 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0)])
                  (f (add1 i)))))])
        (f 0)
        100)
)"), res);
  }